

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void __thiscall ncnn::Mat::clone_from(Mat *this,Mat *mat,Allocator *allocator)

{
  int *piVar1;
  int in_ECX;
  void *in_R8;
  Mat local_58;
  
  clone(&local_58,(__fn *)mat,allocator,in_ECX,in_R8);
  if (local_58.refcount != (int *)0x0) {
    LOCK();
    *local_58.refcount = *local_58.refcount + 1;
    UNLOCK();
  }
  piVar1 = this->refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (this->allocator == (Allocator *)0x0) {
        free(this->data);
      }
      else {
        (*this->allocator->_vptr_Allocator[3])();
      }
    }
  }
  this->data = local_58.data;
  this->refcount = local_58.refcount;
  this->elemsize = local_58.elemsize;
  this->elempack = local_58.elempack;
  this->allocator = local_58.allocator;
  this->dims = local_58.dims;
  this->w = local_58.w;
  this->h = local_58.h;
  this->d = local_58.d;
  this->c = local_58.c;
  this->cstep = local_58.cstep;
  if (local_58.refcount != (int *)0x0) {
    LOCK();
    *local_58.refcount = *local_58.refcount + -1;
    UNLOCK();
    if (*local_58.refcount == 0) {
      if (local_58.allocator == (Allocator *)0x0) {
        free(local_58.data);
        return;
      }
      (*(local_58.allocator)->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

void Mat::clone_from(const ncnn::Mat& mat, Allocator* allocator)
{
    *this = mat.clone(allocator);
}